

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

Parser * __thiscall
flatbuffers::FlatCompiler::GetConformParser
          (Parser *__return_storage_ptr__,FlatCompiler *this,FlatCOptions *options)

{
  string *__rhs;
  bool bVar1;
  int iVar2;
  string contents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [784];
  
  IDLOptions::IDLOptions((IDLOptions *)local_340);
  Parser::Parser(__return_storage_ptr__,(IDLOptions *)local_340);
  IDLOptions::~IDLOptions((IDLOptions *)local_340);
  (__return_storage_ptr__->opts).lang_to_generate = (options->opts).lang_to_generate;
  if ((options->conform_to_schema)._M_string_length != 0) {
    __rhs = &options->conform_to_schema;
    local_340._0_8_ = local_340 + 0x10;
    local_340._8_8_ = 0;
    local_340[0x10] = false;
    bVar1 = LoadFile((__rhs->_M_dataplus)._M_p,true,(string *)local_340);
    if (!bVar1) {
      std::operator+(&local_360,"unable to load schema: ",__rhs);
      (*(this->params_).error_fn)(this,&local_360,true,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
    }
    GetExtension(&local_360,__rhs);
    iVar2 = std::__cxx11::string::compare((char *)&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      LoadBinarySchema(this,__return_storage_ptr__,__rhs,(string *)local_340);
    }
    else {
      ParseFile(this,__return_storage_ptr__,__rhs,(string *)local_340,
                &options->conform_include_directories);
    }
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

flatbuffers::Parser FlatCompiler::GetConformParser(
    const FlatCOptions &options) {
  flatbuffers::Parser conform_parser;

  // conform parser should check advanced options,
  // so, it have to have knowledge about languages:
  conform_parser.opts.lang_to_generate = options.opts.lang_to_generate;

  if (!options.conform_to_schema.empty()) {
    std::string contents;
    if (!flatbuffers::LoadFile(options.conform_to_schema.c_str(), true,
                               &contents)) {
      Error("unable to load schema: " + options.conform_to_schema);
    }

    if (flatbuffers::GetExtension(options.conform_to_schema) ==
        reflection::SchemaExtension()) {
      LoadBinarySchema(conform_parser, options.conform_to_schema, contents);
    } else {
      ParseFile(conform_parser, options.conform_to_schema, contents,
                options.conform_include_directories);
    }
  }
  return conform_parser;
}